

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexedBWT.h
# Opt level: O1

void __thiscall bwtil::IndexedBWT::loadFromFile(IndexedBWT *this,FILE *fp)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  value_type_conflict2 *__val_1;
  pointer __s;
  pointer puVar4;
  value_type *__val;
  packed_view_t local_78;
  vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_> local_48;
  
  fread(this,4,1,(FILE *)fp);
  fread(&this->log_sigma,4,1,(FILE *)fp);
  fread(&this->terminator_position,8,1,(FILE *)fp);
  fread(&this->offrate,8,1,(FILE *)fp);
  fread(&this->number_of_SA_pointers,8,1,(FILE *)fp);
  fread(&this->w,4,1,(FILE *)fp);
  fread(&this->n,8,1,(FILE *)fp);
  (this->bwt_wt).n =
       (ulint)local_78._bits._container.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_48.super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->bwt_wt).nodes.
       super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_48.super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->bwt_wt).nodes.
       super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->bwt_wt).nodes.
       super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->bwt_wt).nodes.
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bwt_wt).nodes.
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bwt_wt).nodes.
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._size = 0;
  std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::~vector
            (&local_48);
  (this->bwt_wt).sigma = (undefined4)local_78._width;
  (this->bwt_wt).log_sigma = local_78._width._4_4_;
  (this->bwt_wt).number_of_nodes = local_78._field_mask;
  std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::~vector
            ((vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_> *)
             ((long)&local_78 + 8));
  WaveletTree::loadFromFile(&this->bwt_wt,fp);
  (this->marked_positions).n = 0;
  puVar1 = (this->marked_positions).bitvector.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->marked_positions).bitvector.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->marked_positions).bitvector.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->marked_positions).bitvector.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (this->marked_positions).rank_ptrs_1.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->marked_positions).rank_ptrs_1.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->marked_positions).rank_ptrs_1.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->marked_positions).rank_ptrs_1.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar2 = (this->marked_positions).rank_ptrs_2.
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->marked_positions).rank_ptrs_2.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->marked_positions).rank_ptrs_2.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->marked_positions).rank_ptrs_2.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  (this->marked_positions).global_rank1 = 0;
  (this->marked_positions).local_rank1 = 0;
  succinct_bitvector::loadFromFile(&this->marked_positions,fp);
  load_packed_view_from_file(&local_78,(ulong)this->w,this->number_of_SA_pointers,fp);
  (this->text_pointers)._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_78._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  puVar1 = (this->text_pointers)._bits._container.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->text_pointers)._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = local_78._bits._container.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->text_pointers)._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_78._bits._container.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_78._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  (this->text_pointers)._field_mask = local_78._field_mask;
  (this->text_pointers)._size = local_78._size;
  (this->text_pointers)._width = local_78._width;
  if (local_78._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78._bits._container.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  __s = (pointer)operator_new(0x800);
  memset(__s,0,0x800);
  puVar1 = (this->FIRST).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->FIRST).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = __s;
  (this->FIRST).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = __s + 0x100;
  (this->FIRST).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __s + 0x100;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar4 = (pointer)operator_new(0x100);
  puVar4[0] = '\0';
  puVar4[1] = '\0';
  puVar4[2] = '\0';
  puVar4[3] = '\0';
  puVar4[4] = '\0';
  puVar4[5] = '\0';
  puVar4[6] = '\0';
  puVar4[7] = '\0';
  puVar4[8] = '\0';
  puVar4[9] = '\0';
  puVar4[10] = '\0';
  puVar4[0xb] = '\0';
  puVar4[0xc] = '\0';
  puVar4[0xd] = '\0';
  puVar4[0xe] = '\0';
  puVar4[0xf] = '\0';
  puVar4[0x10] = '\0';
  puVar4[0x11] = '\0';
  puVar4[0x12] = '\0';
  puVar4[0x13] = '\0';
  puVar4[0x14] = '\0';
  puVar4[0x15] = '\0';
  puVar4[0x16] = '\0';
  puVar4[0x17] = '\0';
  puVar4[0x18] = '\0';
  puVar4[0x19] = '\0';
  puVar4[0x1a] = '\0';
  puVar4[0x1b] = '\0';
  puVar4[0x1c] = '\0';
  puVar4[0x1d] = '\0';
  puVar4[0x1e] = '\0';
  puVar4[0x1f] = '\0';
  puVar4[0x20] = '\0';
  puVar4[0x21] = '\0';
  puVar4[0x22] = '\0';
  puVar4[0x23] = '\0';
  puVar4[0x24] = '\0';
  puVar4[0x25] = '\0';
  puVar4[0x26] = '\0';
  puVar4[0x27] = '\0';
  puVar4[0x28] = '\0';
  puVar4[0x29] = '\0';
  puVar4[0x2a] = '\0';
  puVar4[0x2b] = '\0';
  puVar4[0x2c] = '\0';
  puVar4[0x2d] = '\0';
  puVar4[0x2e] = '\0';
  puVar4[0x2f] = '\0';
  puVar4[0x30] = '\0';
  puVar4[0x31] = '\0';
  puVar4[0x32] = '\0';
  puVar4[0x33] = '\0';
  puVar4[0x34] = '\0';
  puVar4[0x35] = '\0';
  puVar4[0x36] = '\0';
  puVar4[0x37] = '\0';
  puVar4[0x38] = '\0';
  puVar4[0x39] = '\0';
  puVar4[0x3a] = '\0';
  puVar4[0x3b] = '\0';
  puVar4[0x3c] = '\0';
  puVar4[0x3d] = '\0';
  puVar4[0x3e] = '\0';
  puVar4[0x3f] = '\0';
  puVar4[0x40] = '\0';
  puVar4[0x41] = '\0';
  puVar4[0x42] = '\0';
  puVar4[0x43] = '\0';
  puVar4[0x44] = '\0';
  puVar4[0x45] = '\0';
  puVar4[0x46] = '\0';
  puVar4[0x47] = '\0';
  puVar4[0x48] = '\0';
  puVar4[0x49] = '\0';
  puVar4[0x4a] = '\0';
  puVar4[0x4b] = '\0';
  puVar4[0x4c] = '\0';
  puVar4[0x4d] = '\0';
  puVar4[0x4e] = '\0';
  puVar4[0x4f] = '\0';
  puVar4[0x50] = '\0';
  puVar4[0x51] = '\0';
  puVar4[0x52] = '\0';
  puVar4[0x53] = '\0';
  puVar4[0x54] = '\0';
  puVar4[0x55] = '\0';
  puVar4[0x56] = '\0';
  puVar4[0x57] = '\0';
  puVar4[0x58] = '\0';
  puVar4[0x59] = '\0';
  puVar4[0x5a] = '\0';
  puVar4[0x5b] = '\0';
  puVar4[0x5c] = '\0';
  puVar4[0x5d] = '\0';
  puVar4[0x5e] = '\0';
  puVar4[0x5f] = '\0';
  puVar4[0x60] = '\0';
  puVar4[0x61] = '\0';
  puVar4[0x62] = '\0';
  puVar4[99] = '\0';
  puVar4[100] = '\0';
  puVar4[0x65] = '\0';
  puVar4[0x66] = '\0';
  puVar4[0x67] = '\0';
  puVar4[0x68] = '\0';
  puVar4[0x69] = '\0';
  puVar4[0x6a] = '\0';
  puVar4[0x6b] = '\0';
  puVar4[0x6c] = '\0';
  puVar4[0x6d] = '\0';
  puVar4[0x6e] = '\0';
  puVar4[0x6f] = '\0';
  puVar4[0x70] = '\0';
  puVar4[0x71] = '\0';
  puVar4[0x72] = '\0';
  puVar4[0x73] = '\0';
  puVar4[0x74] = '\0';
  puVar4[0x75] = '\0';
  puVar4[0x76] = '\0';
  puVar4[0x77] = '\0';
  puVar4[0x78] = '\0';
  puVar4[0x79] = '\0';
  puVar4[0x7a] = '\0';
  puVar4[0x7b] = '\0';
  puVar4[0x7c] = '\0';
  puVar4[0x7d] = '\0';
  puVar4[0x7e] = '\0';
  puVar4[0x7f] = '\0';
  puVar4[0x80] = '\0';
  puVar4[0x81] = '\0';
  puVar4[0x82] = '\0';
  puVar4[0x83] = '\0';
  puVar4[0x84] = '\0';
  puVar4[0x85] = '\0';
  puVar4[0x86] = '\0';
  puVar4[0x87] = '\0';
  puVar4[0x88] = '\0';
  puVar4[0x89] = '\0';
  puVar4[0x8a] = '\0';
  puVar4[0x8b] = '\0';
  puVar4[0x8c] = '\0';
  puVar4[0x8d] = '\0';
  puVar4[0x8e] = '\0';
  puVar4[0x8f] = '\0';
  puVar4[0x90] = '\0';
  puVar4[0x91] = '\0';
  puVar4[0x92] = '\0';
  puVar4[0x93] = '\0';
  puVar4[0x94] = '\0';
  puVar4[0x95] = '\0';
  puVar4[0x96] = '\0';
  puVar4[0x97] = '\0';
  puVar4[0x98] = '\0';
  puVar4[0x99] = '\0';
  puVar4[0x9a] = '\0';
  puVar4[0x9b] = '\0';
  puVar4[0x9c] = '\0';
  puVar4[0x9d] = '\0';
  puVar4[0x9e] = '\0';
  puVar4[0x9f] = '\0';
  puVar4[0xa0] = '\0';
  puVar4[0xa1] = '\0';
  puVar4[0xa2] = '\0';
  puVar4[0xa3] = '\0';
  puVar4[0xa4] = '\0';
  puVar4[0xa5] = '\0';
  puVar4[0xa6] = '\0';
  puVar4[0xa7] = '\0';
  puVar4[0xa8] = '\0';
  puVar4[0xa9] = '\0';
  puVar4[0xaa] = '\0';
  puVar4[0xab] = '\0';
  puVar4[0xac] = '\0';
  puVar4[0xad] = '\0';
  puVar4[0xae] = '\0';
  puVar4[0xaf] = '\0';
  puVar4[0xb0] = '\0';
  puVar4[0xb1] = '\0';
  puVar4[0xb2] = '\0';
  puVar4[0xb3] = '\0';
  puVar4[0xb4] = '\0';
  puVar4[0xb5] = '\0';
  puVar4[0xb6] = '\0';
  puVar4[0xb7] = '\0';
  puVar4[0xb8] = '\0';
  puVar4[0xb9] = '\0';
  puVar4[0xba] = '\0';
  puVar4[0xbb] = '\0';
  puVar4[0xbc] = '\0';
  puVar4[0xbd] = '\0';
  puVar4[0xbe] = '\0';
  puVar4[0xbf] = '\0';
  puVar4[0xc0] = '\0';
  puVar4[0xc1] = '\0';
  puVar4[0xc2] = '\0';
  puVar4[0xc3] = '\0';
  puVar4[0xc4] = '\0';
  puVar4[0xc5] = '\0';
  puVar4[0xc6] = '\0';
  puVar4[199] = '\0';
  puVar4[200] = '\0';
  puVar4[0xc9] = '\0';
  puVar4[0xca] = '\0';
  puVar4[0xcb] = '\0';
  puVar4[0xcc] = '\0';
  puVar4[0xcd] = '\0';
  puVar4[0xce] = '\0';
  puVar4[0xcf] = '\0';
  puVar4[0xd0] = '\0';
  puVar4[0xd1] = '\0';
  puVar4[0xd2] = '\0';
  puVar4[0xd3] = '\0';
  puVar4[0xd4] = '\0';
  puVar4[0xd5] = '\0';
  puVar4[0xd6] = '\0';
  puVar4[0xd7] = '\0';
  puVar4[0xd8] = '\0';
  puVar4[0xd9] = '\0';
  puVar4[0xda] = '\0';
  puVar4[0xdb] = '\0';
  puVar4[0xdc] = '\0';
  puVar4[0xdd] = '\0';
  puVar4[0xde] = '\0';
  puVar4[0xdf] = '\0';
  puVar4[0xe0] = '\0';
  puVar4[0xe1] = '\0';
  puVar4[0xe2] = '\0';
  puVar4[0xe3] = '\0';
  puVar4[0xe4] = '\0';
  puVar4[0xe5] = '\0';
  puVar4[0xe6] = '\0';
  puVar4[0xe7] = '\0';
  puVar4[0xe8] = '\0';
  puVar4[0xe9] = '\0';
  puVar4[0xea] = '\0';
  puVar4[0xeb] = '\0';
  puVar4[0xec] = '\0';
  puVar4[0xed] = '\0';
  puVar4[0xee] = '\0';
  puVar4[0xef] = '\0';
  puVar4[0xf0] = '\0';
  puVar4[0xf1] = '\0';
  puVar4[0xf2] = '\0';
  puVar4[0xf3] = '\0';
  puVar4[0xf4] = '\0';
  puVar4[0xf5] = '\0';
  puVar4[0xf6] = '\0';
  puVar4[0xf7] = '\0';
  puVar4[0xf8] = '\0';
  puVar4[0xf9] = '\0';
  puVar4[0xfa] = '\0';
  puVar4[0xfb] = '\0';
  puVar4[0xfc] = '\0';
  puVar4[0xfd] = '\0';
  puVar4[0xfe] = '\0';
  puVar4[0xff] = '\0';
  puVar3 = (this->remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = puVar4;
  (this->remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar4 + 0x100;
  (this->remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar4 + 0x100;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,(ulong)this->sigma,
             (allocator_type *)&local_48);
  (this->inverse_remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_78._bits._container.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  puVar3 = (this->inverse_remapping).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->inverse_remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)local_78._bits._container.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  (this->inverse_remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_78._bits._container.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_78._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
  local_78._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3);
  }
  if (local_78._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78._bits._container.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  fread((this->FIRST).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start,8,0x100,(FILE *)fp);
  fread((this->remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start,1,0x100,(FILE *)fp);
  fread((this->inverse_remapping).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start,1,(ulong)this->sigma,(FILE *)fp);
  return;
}

Assistant:

void loadFromFile(FILE *fp){

		ulint numBytes;

		numBytes = fread(&sigma, sizeof(uint), 1, fp);
		assert(numBytes>0);
		numBytes = fread(&log_sigma, sizeof(uint), 1, fp);
		assert(numBytes>0);
		numBytes = fread(&terminator_position, sizeof(ulint), 1, fp);
		assert(numBytes>0);
		numBytes = fread(&offrate, sizeof(ulint), 1, fp);
		assert(numBytes>0);
		numBytes = fread(&number_of_SA_pointers, sizeof(ulint), 1, fp);
		assert(numBytes>0);
		numBytes = fread(&w, sizeof(uint), 1, fp);
		assert(numBytes>0);
		numBytes = fread(&n, sizeof(ulint), 1, fp);
		assert(numBytes>0);

		bwt_wt =  WaveletTree();
		bwt_wt.loadFromFile(fp);

		marked_positions =  succinct_bitvector();
		marked_positions.loadFromFile(fp);
		text_pointers = load_packed_view_from_file(w, number_of_SA_pointers, fp);

		FIRST = vector<ulint>(256);
		remapping = vector<uchar>(256);
		inverse_remapping = vector<uchar>(sigma);

		numBytes = fread(FIRST.data(), sizeof(ulint), 256, fp);
		assert(numBytes>0);
		numBytes = fread(remapping.data(), sizeof(uchar), 256, fp);
		assert(numBytes>0);
		numBytes = fread(inverse_remapping.data(), sizeof(uchar), sigma, fp);
		assert(numBytes>0);

		numBytes++;//avoids "variable not used" warning

	}